

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O2

bool ON_RemoveBezierSingAt1(int dim,int order,int cv_stride,double *cv)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  bool bVar9;
  
  iVar1 = (dim + 1) * order;
  uVar3 = (ulong)order;
  uVar2 = 1;
  if (order < 1) {
    uVar2 = (ulong)(uint)order;
  }
  iVar4 = iVar1 - dim;
  do {
    if ((long)uVar3 < 2) {
LAB_0047f4f2:
      while (iVar1 = (int)uVar2, iVar1 < order) {
        ON_IncreaseBezierDegree(dim,true,iVar1,cv_stride,cv);
        uVar2 = (ulong)(iVar1 + 1);
      }
      return false;
    }
    if ((cv[(long)iVar1 + -1] != 0.0) || (NAN(cv[(long)iVar1 + -1]))) {
      uVar2 = uVar3 & 0xffffffff;
      goto LAB_0047f4f2;
    }
    if (uVar3 == 2) {
      return false;
    }
    uVar3 = uVar3 - 1;
    lVar8 = (long)dim;
    iVar5 = iVar4;
    while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
      lVar6 = (long)iVar5;
      iVar5 = iVar5 + 1;
      if (cv[lVar6] != 0.0) {
        return false;
      }
      if (NAN(cv[lVar6])) {
        return false;
      }
    }
    pdVar7 = cv;
    for (lVar8 = 0; lVar8 < (long)uVar3; lVar8 = lVar8 + 1) {
      for (lVar6 = 0; lVar6 <= dim; lVar6 = lVar6 + 1) {
        pdVar7[lVar6] = (pdVar7[lVar6] * (double)(int)uVar3) / (double)((int)uVar3 - (int)lVar8);
      }
      pdVar7 = pdVar7 + cv_stride;
    }
    iVar1 = iVar1 - (dim + 1);
    iVar4 = iVar4 + ~dim;
  } while( true );
}

Assistant:

bool ON_RemoveBezierSingAt1(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int i,k,ord0,CVlen;
  ord0 = order;
  CVlen=order*cvdim;
  while (order > 1 && cv[CVlen-1] == 0.0) {
    order--;
    if (order < 2)
      return false;
    i = dim; 
    while(i--) {
      if (cv[CVlen-1-i] != 0.0)
        return false;
    }
    for (i=0;  i<order;  i++) {
      for (k=0;  k<cvdim;  k++) 
        cv[i*cv_stride+k] = (order*cv[i*cv_stride+k])/(order-i);
    }
    CVlen -= cvdim;
  }
  while(order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return false;
}